

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

LocalTableStorage * __thiscall
duckdb::LocalTableManager::GetOrCreateStorage
          (LocalTableManager *this,ClientContext *context,DataTable *table)

{
  iterator iVar1;
  element_type *peVar2;
  shared_ptr<duckdb::LocalTableStorage,_true> sVar3;
  shared_ptr<duckdb::LocalTableStorage,_true> new_storage;
  key_type local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  ::std::mutex::lock(&this->table_storage_lock);
  local_58._M_data = table;
  iVar1 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->table_storage)._M_h,&local_58);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    sVar3 = make_shared_ptr<duckdb::LocalTableStorage,duckdb::ClientContext&,duckdb::DataTable&>
                      ((ClientContext *)&stack0xffffffffffffffc0,(DataTable *)context);
    peVar2 = local_40;
    local_50 = local_40;
    local_48._M_pi = _Stack_38._M_pi;
    local_40 = (element_type *)0x0;
    _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_data = table;
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::DataTable>,std::pair<std::reference_wrapper<duckdb::DataTable>const,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>,std::allocator<std::pair<std::reference_wrapper<duckdb::DataTable>const,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::DataTable>,duckdb::ReferenceHashFunction<duckdb::DataTable>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<duckdb::DataTable&,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>>
              ((_Hashtable<std::reference_wrapper<duckdb::DataTable>,std::pair<std::reference_wrapper<duckdb::DataTable>const,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>,std::allocator<std::pair<std::reference_wrapper<duckdb::DataTable>const,duckdb::shared_ptr<duckdb::LocalTableStorage,true>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::DataTable>,duckdb::ReferenceHashFunction<duckdb::DataTable>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->table_storage,&local_58,
               sVar3.internal.
               super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  else {
    peVar2 = *(element_type **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
                     ._M_cur + 0x10);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (LocalTableStorage *)peVar2;
}

Assistant:

LocalTableStorage &LocalTableManager::GetOrCreateStorage(ClientContext &context, DataTable &table) {
	lock_guard<mutex> l(table_storage_lock);
	auto entry = table_storage.find(table);
	if (entry == table_storage.end()) {
		auto new_storage = make_shared_ptr<LocalTableStorage>(context, table);
		auto storage = new_storage.get();
		table_storage.insert(make_pair(reference<DataTable>(table), std::move(new_storage)));
		return *storage;
	} else {
		return *entry->second.get();
	}
}